

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

void __thiscall QCommandLineParser::process(QCommandLineParser *this,QStringList *arguments)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  byte bVar5;
  QCommandLineParserPrivate *pQVar6;
  QArrayData *this_00;
  long in_FS_OFFSET;
  QString local_c8;
  Data *local_a8;
  char16_t *pcStack_a0;
  qsizetype local_98;
  ConvertTo local_90;
  QString local_78;
  char *local_60;
  undefined8 local_58;
  Data *local_50;
  char16_t *pcStack_48;
  qsizetype local_40;
  undefined2 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QCommandLineParserPrivate::parse(this->d,arguments);
  if (!bVar4) {
    QCoreApplication::applicationName();
    qVar3 = local_98;
    pcVar2 = pcStack_a0;
    pDVar1 = local_a8;
    local_98 = 0;
    local_a8 = (Data *)0x0;
    pcStack_a0 = (char16_t *)0x0;
    errorText(&local_c8,this);
    local_40 = local_c8.d.size;
    pcStack_48 = local_c8.d.ptr;
    local_50 = local_c8.d.d;
    local_c8.d.size = 0;
    local_78.d.d = pDVar1;
    local_78.d.ptr = pcVar2;
    local_78.d.size = qVar3;
    local_60 = ": ";
    local_58 = 2;
    local_c8.d.d = (Data *)0x0;
    local_c8.d.ptr = (char16_t *)0x0;
    local_38 = 10;
    QStringBuilder::operator_cast_to_QString(&local_90,(QStringBuilder *)&local_78);
    showMessageAndExit(Error,&local_90,1);
  }
  pQVar6 = this->d;
  if (pQVar6->builtinVersionOption == true) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"version";
    local_78.d.size = 7;
    this_00 = (QArrayData *)this;
    bVar4 = isSet(this,&local_78);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        this_00 = &(local_78.d.d)->super_QArrayData;
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar4) {
      showVersion((QCommandLineParser *)this_00);
    }
    pQVar6 = this->d;
  }
  bVar5 = pQVar6->builtinHelpOption;
  if ((bool)bVar5 == true) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"help";
    local_78.d.size = 4;
    bVar4 = isSet(this,&local_78);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar4) {
      QCommandLineParserPrivate::showHelp(this->d,0,false);
    }
    bVar5 = this->d->builtinHelpOption;
  }
  if ((bVar5 & 1) != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"help-all";
    local_78.d.size = 8;
    bVar4 = isSet(this,&local_78);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar4) {
      QCommandLineParserPrivate::showHelp(this->d,0,true);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCommandLineParser::process(const QStringList &arguments)
{
    if (!d->parse(arguments)) {
        showMessageAndExit(MessageType::Error,
                           QCoreApplication::applicationName() + ": "_L1 + errorText() + u'\n',
                           EXIT_FAILURE);
    }

    if (d->builtinVersionOption && isSet(QStringLiteral("version")))
        showVersion();

    if (d->builtinHelpOption && isSet(QStringLiteral("help")))
        d->showHelp(EXIT_SUCCESS, false);

    if (d->builtinHelpOption && isSet(QStringLiteral("help-all")))
        d->showHelp(EXIT_SUCCESS, true);
}